

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,DWORD_PTR sourceContext,char16 *url,size_t len,
          SimpleDataCacheWrapper *dataCacheWrapper,char16 *sourceMapUrl,size_t sourceMapUrlLen)

{
  code *pcVar1;
  AutoCriticalSection AVar2;
  bool bVar3;
  uint uVar4;
  SourceContextInfo *pSVar5;
  undefined4 *puVar6;
  Recycler *alloc;
  char16 *pcVar7;
  SourceDynamicProfileManager *ptr;
  undefined1 local_80 [8];
  TrackAllocData data;
  DWORD_PTR sourceContext_local;
  AutoCriticalSection local_48;
  AutoCriticalSection autocs;
  SourceContextInfo *sourceContextInfo;
  
  local_48.cs = &this->threadContext->csFunctionBody;
  data._32_8_ = sourceContext;
  CCLock::Enter(&(local_48.cs)->super_CCLock);
  EnsureSourceContextInfoMap(this);
  pSVar5 = GetSourceContextInfo(this,sourceContext,dataCacheWrapper);
  if (pSVar5 != (SourceContextInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xbe4,
                                "(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr)"
                                ,
                                "this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr"
                               );
    if (!bVar3) goto LAB_006f019e;
    *puVar6 = 0;
  }
  local_80 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0xbe5;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_80);
  pSVar5 = (SourceContextInfo *)new<Memory::Recycler>(0x38,alloc,0x51e21e);
  (pSVar5->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  autocs.cs = (CriticalSection *)pSVar5;
  uVar4 = GetNextSourceContextId(this);
  pSVar5->sourceContextId = uVar4;
  pSVar5->dwHostSourceContext = sourceContext;
  pSVar5->isHostDynamicDocument = false;
  (pSVar5->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  if (url != (char16 *)0x0) {
    pcVar7 = CopyString(url,len,&this->sourceCodeAllocator);
    (pSVar5->field_5).field_0.url = pcVar7;
  }
  if (sourceMapUrlLen != 0 && sourceMapUrl != (char16 *)0x0) {
    pcVar7 = CopyString(sourceMapUrl,sourceMapUrlLen,&this->sourceCodeAllocator);
    (pSVar5->field_5).field_0.sourceMapUrl = pcVar7;
  }
  if (this->startupComplete == false) {
    ptr = SourceDynamicProfileManager::LoadFromDynamicProfileStorage(pSVar5,this,dataCacheWrapper);
    Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::WriteBarrierSet
              (&pSVar5->sourceDynamicProfileManager,ptr);
    if ((pSVar5->sourceDynamicProfileManager).ptr == (SourceDynamicProfileManager *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xbfb,
                                  "(sourceContextInfo->sourceDynamicProfileManager != __null)",
                                  "sourceContextInfo->sourceDynamicProfileManager != NULL");
      if (!bVar3) {
LAB_006f019e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  JsUtil::
  BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(((this->super_ScriptContextBase).javascriptLibrary)->cache).sourceContextInfoMap.
                ptr,(unsigned_long *)&data.line,(SourceContextInfo **)&autocs);
  AVar2 = autocs;
  AutoCriticalSection::~AutoCriticalSection(&local_48);
  return (SourceContextInfo *)AVar2.cs;
}

Assistant:

SourceContextInfo * ScriptContext::CreateSourceContextInfo(DWORD_PTR sourceContext, char16 const * url, size_t len,
        SimpleDataCacheWrapper* dataCacheWrapper, char16 const * sourceMapUrl /*= NULL*/, size_t sourceMapUrlLen /*= 0*/)
    {
        // Take etw rundown lock on this thread context. We are going to init/add to sourceContextInfoMap.
        AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());

        EnsureSourceContextInfoMap();
        Assert(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr);
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = sourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = nullptr;
#endif

        if (url != nullptr)
        {
            sourceContextInfo->url = CopyString(url, len, this->SourceCodeAllocator());
            JS_ETW(EtwTrace::LogSourceModuleLoadEvent(this, sourceContext, url));
        }
        if (sourceMapUrl != nullptr && sourceMapUrlLen != 0)
        {
            sourceContextInfo->sourceMapUrl = CopyString(sourceMapUrl, sourceMapUrlLen, this->SourceCodeAllocator());
        }

#if ENABLE_PROFILE_INFO
        if (!this->startupComplete)
        {
            sourceContextInfo->sourceDynamicProfileManager = SourceDynamicProfileManager::LoadFromDynamicProfileStorage(sourceContextInfo, this, dataCacheWrapper);
            Assert(sourceContextInfo->sourceDynamicProfileManager != NULL);
        }

        this->Cache()->sourceContextInfoMap->Add(sourceContext, sourceContextInfo);
#endif
        return sourceContextInfo;
    }